

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

char * getSelectionString(Atom selection)

{
  int iVar1;
  Window WVar2;
  char *pcVar3;
  Atom in_RDI;
  char *string;
  size_t size;
  XEvent dummy;
  XEvent notification;
  unsigned_long bytesAfter;
  unsigned_long itemCount;
  int actualFormat;
  Atom actualType;
  char *data;
  size_t i;
  size_t targetCount;
  Atom targets [2];
  char **selectionString;
  Atom *source;
  unsigned_long *puVar4;
  char *local_210;
  size_t local_208;
  undefined8 in_stack_fffffffffffffea8;
  XEvent local_140;
  unsigned_long local_80;
  unsigned_long local_78;
  int local_6c;
  Atom local_68;
  uchar *local_60;
  ulong local_58;
  undefined8 local_50;
  Atom local_48 [3];
  char **local_30;
  Atom local_28;
  char *local_20;
  
  local_48[0] = _glfw.x11.UTF8_STRING;
  local_48[1] = 0x1f;
  local_50 = 2;
  if (in_RDI == _glfw.x11.PRIMARY) {
    local_30 = &_glfw.x11.primarySelectionString;
  }
  else {
    local_30 = &_glfw.x11.clipboardString;
  }
  local_28 = in_RDI;
  WVar2 = (*_glfw.x11.xlib.GetSelectionOwner)(_glfw.x11.display,in_RDI);
  if (WVar2 == _glfw.x11.helperWindowHandle) {
    local_20 = *local_30;
  }
  else {
    free(*local_30);
    *local_30 = (char *)0x0;
    for (local_58 = 0; local_58 < 2; local_58 = local_58 + 1) {
      (*_glfw.x11.xlib.ConvertSelection)
                (_glfw.x11.display,local_28,local_48[local_58],_glfw.x11.GLFW_SELECTION,
                 _glfw.x11.helperWindowHandle,0);
      while (iVar1 = (*_glfw.x11.xlib.CheckTypedWindowEvent)
                               (_glfw.x11.display,_glfw.x11.helperWindowHandle,0x1f,&local_140),
            iVar1 == 0) {
        waitForEvent((double *)in_stack_fffffffffffffea8);
      }
      if (local_140.xkey.time != 0) {
        (*_glfw.x11.xlib.CheckIfEvent)
                  (_glfw.x11.display,(XEvent *)&stack0xfffffffffffffe00,isSelPropNewValueNotify,
                   (XPointer)&local_140.type);
        source = &local_68;
        puVar4 = &local_78;
        (*_glfw.x11.xlib.GetWindowProperty)
                  (_glfw.x11.display,local_140.xany.window,local_140.xselectionrequest.target,0,
                   0x7fffffffffffffff,1,0,source,&local_6c,puVar4,&local_80,&local_60);
        if (local_68 == _glfw.x11.INCR) {
          local_208 = 1;
          local_210 = (char *)0x0;
          do {
            while (iVar1 = (*_glfw.x11.xlib.CheckIfEvent)
                                     (_glfw.x11.display,(XEvent *)&stack0xfffffffffffffe00,
                                      isSelPropNewValueNotify,(XPointer)&local_140.type), iVar1 == 0
                  ) {
              waitForEvent((double *)in_stack_fffffffffffffea8);
            }
            (*_glfw.x11.xlib.Free)(local_60);
            puVar4 = &local_78;
            (*_glfw.x11.xlib.GetWindowProperty)
                      (_glfw.x11.display,local_140.xany.window,local_140.xselectionrequest.target,0,
                       0x7fffffffffffffff,1,0,&local_68,&local_6c,puVar4,&local_80,&local_60);
            if (local_78 != 0) {
              local_208 = local_78 + local_208;
              local_210 = (char *)realloc(local_210,local_208);
              local_210[(local_208 - local_78) + -1] = '\0';
              strcat(local_210,(char *)local_60);
            }
          } while (local_78 != 0);
          if (local_48[local_58] == 0x1f) {
            pcVar3 = convertLatin1toUTF8((char *)puVar4);
            *local_30 = pcVar3;
            free(local_210);
          }
          else {
            *local_30 = local_210;
          }
        }
        else if (local_68 == local_48[local_58]) {
          if (local_48[local_58] == 0x1f) {
            pcVar3 = convertLatin1toUTF8((char *)puVar4);
            *local_30 = pcVar3;
          }
          else {
            pcVar3 = _glfw_strdup((char *)source);
            *local_30 = pcVar3;
          }
        }
        (*_glfw.x11.xlib.Free)(local_60);
        if (*local_30 != (char *)0x0) break;
      }
    }
    if (*local_30 == (char *)0x0) {
      _glfwInputError(0x10009,"X11: Failed to convert selection to string");
    }
    local_20 = *local_30;
  }
  return local_20;
}

Assistant:

static const char* getSelectionString(Atom selection)
{
    char** selectionString = NULL;
    const Atom targets[] = { _glfw.x11.UTF8_STRING, XA_STRING };
    const size_t targetCount = sizeof(targets) / sizeof(targets[0]);

    if (selection == _glfw.x11.PRIMARY)
        selectionString = &_glfw.x11.primarySelectionString;
    else
        selectionString = &_glfw.x11.clipboardString;

    if (XGetSelectionOwner(_glfw.x11.display, selection) ==
        _glfw.x11.helperWindowHandle)
    {
        // Instead of doing a large number of X round-trips just to put this
        // string into a window property and then read it back, just return it
        return *selectionString;
    }

    free(*selectionString);
    *selectionString = NULL;

    for (size_t i = 0;  i < targetCount;  i++)
    {
        char* data;
        Atom actualType;
        int actualFormat;
        unsigned long itemCount, bytesAfter;
        XEvent notification, dummy;

        XConvertSelection(_glfw.x11.display,
                          selection,
                          targets[i],
                          _glfw.x11.GLFW_SELECTION,
                          _glfw.x11.helperWindowHandle,
                          CurrentTime);

        while (!XCheckTypedWindowEvent(_glfw.x11.display,
                                       _glfw.x11.helperWindowHandle,
                                       SelectionNotify,
                                       &notification))
        {
            waitForEvent(NULL);
        }

        if (notification.xselection.property == None)
            continue;

        XCheckIfEvent(_glfw.x11.display,
                      &dummy,
                      isSelPropNewValueNotify,
                      (XPointer) &notification);

        XGetWindowProperty(_glfw.x11.display,
                           notification.xselection.requestor,
                           notification.xselection.property,
                           0,
                           LONG_MAX,
                           True,
                           AnyPropertyType,
                           &actualType,
                           &actualFormat,
                           &itemCount,
                           &bytesAfter,
                           (unsigned char**) &data);

        if (actualType == _glfw.x11.INCR)
        {
            size_t size = 1;
            char* string = NULL;

            for (;;)
            {
                while (!XCheckIfEvent(_glfw.x11.display,
                                      &dummy,
                                      isSelPropNewValueNotify,
                                      (XPointer) &notification))
                {
                    waitForEvent(NULL);
                }

                XFree(data);
                XGetWindowProperty(_glfw.x11.display,
                                   notification.xselection.requestor,
                                   notification.xselection.property,
                                   0,
                                   LONG_MAX,
                                   True,
                                   AnyPropertyType,
                                   &actualType,
                                   &actualFormat,
                                   &itemCount,
                                   &bytesAfter,
                                   (unsigned char**) &data);

                if (itemCount)
                {
                    size += itemCount;
                    string = realloc(string, size);
                    string[size - itemCount - 1] = '\0';
                    strcat(string, data);
                }

                if (!itemCount)
                {
                    if (targets[i] == XA_STRING)
                    {
                        *selectionString = convertLatin1toUTF8(string);
                        free(string);
                    }
                    else
                        *selectionString = string;

                    break;
                }
            }
        }
        else if (actualType == targets[i])
        {
            if (targets[i] == XA_STRING)
                *selectionString = convertLatin1toUTF8(data);
            else
                *selectionString = _glfw_strdup(data);
        }

        XFree(data);

        if (*selectionString)
            break;
    }

    if (!*selectionString)
    {
        _glfwInputError(GLFW_FORMAT_UNAVAILABLE,
                        "X11: Failed to convert selection to string");
    }

    return *selectionString;
}